

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uchar.cpp
# Opt level: O2

int32_t uscript_getScriptExtensions_63
                  (UChar32 c,UScriptCode *scripts,int32_t capacity,UErrorCode *pErrorCode)

{
  ushort uVar1;
  UScriptCode UVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ushort *puVar6;
  UScriptCode UVar7;
  
  uVar4 = 0;
  if ((pErrorCode != (UErrorCode *)0x0) && (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR)) {
    if ((capacity < 0) || (scripts == (UScriptCode *)0x0 && capacity != 0)) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      UVar2 = u_getUnicodeProperties_63(c,0);
      UVar7 = UVar2 & 0xc000ff;
      if ((uint)UVar7 < 0x400000) {
        if (capacity == 0) {
          *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
        }
        else {
          *scripts = UVar7;
        }
        uVar4 = 1;
      }
      else {
        uVar5 = (ulong)(uint)(UVar2 & (USCRIPT_MATHEMATICAL_NOTATION|USCRIPT_TAI_VIET));
        if (0xbfffff < (uint)UVar7) {
          uVar5 = (ulong)scriptExtensions[uVar5 + 1];
        }
        puVar6 = scriptExtensions + uVar5;
        uVar5 = 0;
        do {
          while( true ) {
            uVar1 = *puVar6;
            puVar6 = puVar6 + 1;
            iVar3 = (int)uVar5;
            if (capacity <= iVar3) break;
            scripts[uVar5] = (uint)uVar1 & 0x7fff;
            uVar5 = (ulong)(iVar3 + 1U);
            if ((short)uVar1 < 0) {
              return iVar3 + 1U;
            }
          }
          uVar4 = iVar3 + 1;
          uVar5 = (ulong)uVar4;
        } while (-1 < (short)uVar1);
        *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
      }
    }
  }
  return uVar4;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uscript_getScriptExtensions(UChar32 c,
                            UScriptCode *scripts, int32_t capacity,
                            UErrorCode *pErrorCode) {
    uint32_t scriptX;
    int32_t length;
    const uint16_t *scx;
    uint16_t sx;
    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return 0;
    }
    if(capacity<0 || (capacity>0 && scripts==NULL)) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }
    scriptX=u_getUnicodeProperties(c, 0)&UPROPS_SCRIPT_X_MASK;
    if(scriptX<UPROPS_SCRIPT_X_WITH_COMMON) {
        if(capacity==0) {
            *pErrorCode=U_BUFFER_OVERFLOW_ERROR;
        } else {
            scripts[0]=(UScriptCode)scriptX;
        }
        return 1;
    }

    scx=scriptExtensions+(scriptX&UPROPS_SCRIPT_MASK);
    if(scriptX>=UPROPS_SCRIPT_X_WITH_OTHER) {
        scx=scriptExtensions+scx[1];
    }
    length=0;
    do {
        sx=*scx++;
        if(length<capacity) {
            scripts[length]=(UScriptCode)(sx&0x7fff);
        }
        ++length;
    } while(sx<0x8000);
    if(length>capacity) {
        *pErrorCode=U_BUFFER_OVERFLOW_ERROR;
    }
    return length;
}